

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstSerialise.cpp
# Opt level: O3

void __thiscall enact::AstSerialise::visitCallExpr_abi_cxx11_(AstSerialise *this)

{
  CallExpr *in_RDX;
  long in_RSI;
  
  visitCallExpr_abi_cxx11_((string *)this,(AstSerialise *)(in_RSI + -8),in_RDX);
  return;
}

Assistant:

std::string AstSerialise::visitCallExpr(CallExpr &expr) {
        std::stringstream s;

        s << "(() " << visitExpr(*expr.callee);
        for (auto &arg : expr.args) {
            s << " " << visitExpr(*arg);
        }
        s << ")";

        return s.str();
    }